

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstack.cc
# Opt level: O2

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *this;
  __shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_ptr<pstack::Procman::LiveProcess,_(__gnu_cxx::_Lock_policy)2> *__r_00;
  __ptrace_request __request;
  double dVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  __pid_t _Var6;
  __pid_t _Var7;
  undefined8 uVar8;
  Flags *pFVar9;
  size_type __n;
  FILE *__stream;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ostream *poVar13;
  int *piVar14;
  char *pcVar15;
  uint uVar16;
  size_type __pos;
  long lVar17;
  undefined1 auVar18 [8];
  ulong uVar19;
  double dVar20;
  undefined1 local_26f8 [8];
  char line [4096];
  char statusBuf [4096];
  undefined1 local_6f0 [8];
  ofstream out;
  sigaction local_4f0;
  undefined1 auStack_458 [8];
  Flags flags;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  _Any_data local_3a8;
  code *local_398;
  code *local_390;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  _Any_data local_368;
  code *local_358;
  code *local_350;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  _Any_data local_308;
  code *local_2f8;
  code *local_2f0;
  _Any_data local_2e8;
  code *local_2d8;
  code *local_2d0;
  undefined1 local_2c8 [8];
  Context context;
  ostream *local_250;
  undefined1 local_240;
  undefined1 local_23f [2];
  undefined1 local_23d;
  undefined1 local_23c;
  undefined1 local_23b [3];
  undefined1 local_238 [4];
  undefined1 local_234 [12];
  int local_228;
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  undefined1 local_1e8 [8];
  string execName;
  unique_ptr<_IO_FILE,_closer> statusFile;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  undefined1 local_188 [8];
  string subprocessCmd;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  code *local_158;
  code *local_150;
  undefined1 local_148 [8];
  int status;
  code *local_138;
  code *local_130;
  undefined1 local_128 [16];
  code *local_118;
  code *local_110;
  undefined1 local_108 [8];
  pid_t pid;
  code *local_f8;
  code *local_f0;
  undefined1 auStack_e8 [8];
  sptr exec;
  double local_c0;
  double sleepTime;
  shared_ptr<pstack::Procman::Process> p;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int local_54 [2];
  int exitCode;
  char **local_48;
  undefined1 local_39;
  uint local_38;
  bool printAllStacks;
  
  pstack::Context::Context((Context *)local_2c8);
  memset(&local_4f0.sa_mask,0,0x90);
  local_4f0.__sigaction_handler.sa_handler = main::anon_class_1_0_00000001::__invoke;
  local_4f0.sa_flags = -0x80000000;
  sigaction(2,&local_4f0,(sigaction *)0x0);
  local_c0 = 0.0;
  local_48 = argv;
  std::ofstream::ofstream(local_6f0);
  local_1e8 = (undefined1  [8])&execName._M_string_length;
  execName._M_dataplus._M_p = (pointer)0x0;
  local_54[0] = -1;
  local_188 = (undefined1  [8])&subprocessCmd._M_string_length;
  subprocessCmd._M_dataplus._M_p = (pointer)0x0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&flags.data;
  flags.longOptions.super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_458 = (undefined1  [8])0x0;
  flags.longOptions.super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flags.data._M_t._M_impl._0_4_ = 0;
  execName._M_string_length._0_1_ = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  subprocessCmd._M_string_length._0_1_ = 0;
  local_39 = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&flags.shortOptions._M_string_length;
  flags.shortOptions._M_dataplus._M_p = (pointer)0x0;
  flags.shortOptions._M_string_length._0_1_ = 0;
  flags.shortOptions.field_2._8_4_ = 0xfffffffe;
  local_198 = (code *)0x0;
  pcStack_190 = (code *)0x0;
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_1a8._M_unused._M_object = operator_new(0x18);
  *(char ****)local_1a8._M_unused._0_8_ = &local_48;
  *(undefined1 **)((long)local_1a8._M_unused._0_8_ + 8) = auStack_458;
  *(Context **)((long)local_1a8._M_unused._0_8_ + 0x10) = (Context *)local_2c8;
  pcStack_190 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:231:13)>
                ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:231:13)>
              ::_M_manager;
  uVar8 = pstack::Flags::add(auStack_458,"replace-path",0x46,"from:to",
                             "replace `from` with `to` in paths when finding shared libraries");
  flags._104_8_ = (Context *)local_2c8;
  uVar8 = pstack::Flags::add(uVar8,"debug-dir",0x67,"directory",
                             "extra location to find debug files for binaries and shared libraries")
  ;
  local_3c8._8_8_ = 0;
  local_3c8._M_unused._M_object = &local_c0;
  local_3b0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_invoke;
  local_3b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  uVar8 = pstack::Flags::add(uVar8,"constant",0x62,"delay",
                             "repeat pstack, with `delay` seconds between each iteration (can be non-integer)"
                            );
  local_390 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:254:13)>
              ::_M_invoke;
  local_398 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:254:13)>
              ::_M_manager;
  local_3a8._M_unused._0_8_ = (undefined8)(Context *)local_2c8;
  local_3a8._8_8_ = local_54;
  uVar8 = pstack::Flags::add(uVar8,"elf-dump",100,"ELF file",
                             "dump details of an ELF image in JSON and exit");
  local_370 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:262:13)>
              ::_M_invoke;
  local_378 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:262:13)>
              ::_M_manager;
  local_388._M_unused._0_8_ = (Context *)local_2c8;
  local_388._8_8_ = local_54;
  uVar8 = pstack::Flags::add(uVar8,"dwarf-dump",0x44,"ELF file",
                             "dump details of DWARF information in an ELF image in JSON and exit");
  local_368._M_unused._M_object = local_238;
  local_368._8_8_ = 0;
  local_350 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_invoke;
  local_358 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  uVar8 = pstack::Flags::add(uVar8,"depth",0x72,"depth","max depth when printing python structures")
  ;
  local_348._8_8_ = 0;
  local_348._M_unused._M_object = local_234;
  local_330 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_invoke;
  local_338 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  pFVar9 = (Flags *)pstack::Flags::add(uVar8,"max-frames",0x4d,"max frames",
                                       "maximum number of stack frames to print for a thread");
  statusBuf[8] = '\0';
  statusBuf[9] = '\0';
  statusBuf[10] = '\0';
  statusBuf[0xb] = '\0';
  statusBuf[0xc] = '\0';
  statusBuf[0xd] = '\0';
  statusBuf[0xe] = '\0';
  statusBuf[0xf] = '\0';
  statusBuf[0x10] = '\0';
  statusBuf[0x11] = '\0';
  statusBuf[0x12] = '\0';
  statusBuf[0x13] = '\0';
  statusBuf[0x14] = '\0';
  statusBuf[0x15] = '\0';
  statusBuf[0x16] = '\0';
  statusBuf[0x17] = '\0';
  line[0xff8] = '\0';
  line[0xff9] = '\0';
  line[0xffa] = '\0';
  line[0xffb] = '\0';
  line[0xffc] = '\0';
  line[0xffd] = '\0';
  line[0xffe] = '\0';
  line[0xfff] = '\0';
  statusBuf[0] = '\0';
  statusBuf[1] = '\0';
  statusBuf[2] = '\0';
  statusBuf[3] = '\0';
  statusBuf[4] = '\0';
  statusBuf[5] = '\0';
  statusBuf[6] = '\0';
  statusBuf[7] = '\0';
  line._4088_8_ = operator_new(0x18);
  *(int **)line._4088_8_ = local_54;
  *(char ****)(line._4088_8_ + 8) = &local_48;
  *(undefined1 **)(line._4088_8_ + 0x10) = auStack_458;
  statusBuf._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:283:13)>
       ::_M_invoke;
  statusBuf._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:283:13)>
       ::_M_manager;
  pFVar9 = pstack::Flags::add(pFVar9,"help",0x68,"generate this help message",(VCb *)(line + 0xff8))
  ;
  local_26f8 = (undefined1  [8])local_23f;
  line[0] = '\x01';
  line[1] = '\0';
  line[2] = '\0';
  line[3] = '\0';
  line[4] = '\0';
  line[5] = '\0';
  line[6] = '\0';
  line[7] = '\0';
  line._16_8_ = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  line._8_8_ = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
               ::_M_manager;
  pFVar9 = pstack::Flags::add(pFVar9,"args",0x61,
                              "attempt to show the value of arguments to functions",
                              (VCb *)local_26f8);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  auStack_88 = (undefined1  [8])&(anonymous_namespace)::doJson;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_manager;
  pFVar9 = pstack::Flags::add(pFVar9,"json",0x6a,"use JSON output rather than plaintext",
                              (VCb *)auStack_88);
  sleepTime = (double)&local_240;
  p.super___shared_ptr<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  p.super___shared_ptr<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
       ::_M_manager;
  pFVar9 = pstack::Flags::add(pFVar9,"no-src",0x73,"don\'t include source info",(VCb *)&sleepTime);
  local_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_150 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:303:13)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:303:13)>
              ::_M_manager;
  subprocessCmd.field_2._8_8_ = local_2c8;
  pFVar9 = pstack::Flags::add(pFVar9,"verbose",0x76,"more debugging data. Can be repeated",
                              (VCb *)((long)&subprocessCmd.field_2 + 8));
  auStack_e8 = (undefined1  [8])&local_23d;
  exec.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  exec.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
       ::_M_manager;
  pFVar9 = pstack::Flags::add(pFVar9,"no-threaddb",0x74,
                              "don\'t use the thread_db functions to enumerate pthreads (just uses LWPs)"
                              ,(VCb *)auStack_e8);
  local_128._8_8_ = 1;
  local_128._0_8_ = &local_39;
  local_110 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar9 = pstack::Flags::add(pFVar9,"all",0x41,
                              "show both python and DWARF (C/C++/go/rust) stack traces",
                              (VCb *)local_128);
  execName.field_2._8_8_ = local_23b;
  pFVar9 = pstack::Flags::add(pFVar9,"no-ext-debug",0x6e,
                              "don\'t load external debugging information when processing",
                              (VCb *)((long)&execName.field_2 + 8));
  _status = 0;
  local_130 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:323:13)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:323:13)>
              ::_M_manager;
  local_148 = (undefined1  [8])local_54;
  pFVar9 = pstack::Flags::add(pFVar9,"version",0x56,"dump version and exit",(VCb *)local_148);
  local_328._8_8_ = 0;
  local_328._M_unused._M_object = local_1e8;
  local_310 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:346:43)>
              ::_M_invoke;
  local_318 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:346:43)>
              ::_M_manager;
  uVar8 = pstack::Flags::add(pFVar9,"executable",0x65,"executable","executable to use by default");
  local_308._8_8_ = 0;
  local_308._M_unused._M_object = local_188;
  local_2f0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_invoke;
  local_2f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  pFVar9 = (Flags *)pstack::Flags::add(uVar8,"command",0x78,"command line",
                                       "execute command line as subprocess, trace when it receives a signal"
                                      );
  local_108 = (undefined1  [8])&local_23c;
  _pid = 1;
  local_f0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
             ::_M_manager;
  pFVar9 = pstack::Flags::add(pFVar9,"no-die-names",0x59,"do not use DIE names for functions",
                              (VCb *)local_108);
  local_208._8_8_ = 1;
  local_208._M_unused._M_object = &(anonymous_namespace)::freeres;
  local_1f0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_invoke;
  local_1f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar9 = pstack::Flags::add(pFVar9,"freeres",0,
                              "free all memory at exit (useful for valgrind/heapcheck)",
                              (VCb *)&local_208);
  local_2e8._8_8_ = local_6f0;
  local_2d0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:359:62)>
              ::_M_invoke;
  local_2d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:359:62)>
              ::_M_manager;
  local_2e8._M_unused._M_object = local_2c8;
  iVar4 = pstack::Flags::add(pFVar9,"output",0x6f,"output file",
                             "write output to <output file> instead of stdout");
  pstack::Flags::parse(iVar4,(char **)(ulong)(uint)argc);
  std::_Function_base::~_Function_base((_Function_base *)&local_2e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_208);
  std::_Function_base::~_Function_base((_Function_base *)local_108);
  std::_Function_base::~_Function_base((_Function_base *)&local_308);
  std::_Function_base::~_Function_base((_Function_base *)&local_328);
  std::_Function_base::~_Function_base((_Function_base *)local_148);
  std::_Function_base::~_Function_base((_Function_base *)((long)&execName.field_2 + 8));
  std::_Function_base::~_Function_base((_Function_base *)local_128);
  std::_Function_base::~_Function_base((_Function_base *)auStack_e8);
  std::_Function_base::~_Function_base((_Function_base *)((long)&subprocessCmd.field_2 + 8));
  std::_Function_base::~_Function_base((_Function_base *)&sleepTime);
  std::_Function_base::~_Function_base((_Function_base *)auStack_88);
  std::_Function_base::~_Function_base((_Function_base *)local_26f8);
  std::_Function_base::~_Function_base((_Function_base *)(line + 0xff8));
  std::_Function_base::~_Function_base((_Function_base *)&local_348);
  std::_Function_base::~_Function_base((_Function_base *)&local_368);
  std::_Function_base::~_Function_base((_Function_base *)&local_388);
  std::_Function_base::~_Function_base((_Function_base *)&local_3a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_3c8);
  std::_Function_base::~_Function_base((_Function_base *)&flags.longVal);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  iVar4 = local_54[0];
  if (local_54[0] == -1) {
    auStack_e8 = (undefined1  [8])0x0;
    exec.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1e8,"");
    if (!bVar3) {
      pstack::Context::getImageForName((string *)(line + 0xff8),SUB81(local_2c8,0));
      std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)auStack_e8,
                 (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)(line + 0xff8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)statusBuf);
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_188,"");
    dVar1 = local_c0;
    if (bVar3) {
      lVar17 = (long)_optind;
      if (_optind == argc) {
        anon_unknown.dwarf_15934::usage((ostream *)&std::cerr,*local_48,(Flags *)auStack_458);
        iVar4 = 0x40;
      }
      else {
        dVar20 = local_c0 * 1000000.0;
        local_38 = 0;
        for (; lVar17 < argc; lVar17 = lVar17 + 1) {
          std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)&sleepTime,
                     (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)auStack_e8);
          this = (string *)(line + 0xff8);
          std::__cxx11::string::string<std::allocator<char>>
                    (this,local_48[lVar17],(allocator<char> *)local_26f8);
          pstack::Procman::Process::load
                    (auStack_88,local_2c8,
                     (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)&sleepTime,
                     this);
          std::__cxx11::string::~string(this);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
          auVar18 = auStack_88;
          __r = (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)
                ((long)&subprocessCmd.field_2 + 8);
          if (auStack_88 == (undefined1  [8])0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_26f8,local_48[lVar17],(allocator<char> *)local_128);
            pstack::Context::getImageForName((string *)__r,SUB81(local_2c8,0));
            std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)auStack_e8,
                       __r);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160);
            std::__cxx11::string::~string((string *)local_26f8);
          }
          else {
            while ((anonymous_namespace)::interrupted == '\0') {
              anon_unknown.dwarf_15934::pstack((Process *)auVar18);
              if ((dVar1 == 0.0) && (!NAN(dVar1))) break;
              usleep((__useconds_t)(long)dVar20);
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&args);
        }
        iVar4 = 0;
        if ((local_38 & 1) != 0) {
          iVar4 = 0x46;
        }
      }
    }
    else {
      std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)local_128,
                 (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)auStack_e8);
      auStack_88 = (undefined1  [8])0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __pos = 0;
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(line + 0xff8);
      while (__n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_188,' ',__pos), __n != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   __pos,__n);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_88,
                   __return_storage_ptr__);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        __pos = __n + 1;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(line + 0xff8)
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                 __pos,0xffffffffffffffff);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(line + 0xff8)
                );
      std::__cxx11::string::~string((string *)(line + 0xff8));
      uVar5 = fork();
      local_108._0_4_ = uVar5;
      if (uVar5 != 0xffffffff) {
        if (uVar5 == 0) {
          lVar17 = ptrace(PTRACE_TRACEME,0,0,0);
          pbVar2 = args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)lVar17 != 0) {
            pcVar15 = "rc == 0";
            uVar5 = 0x4b;
LAB_0010a64e:
            __assert_fail(pcVar15,
                          "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc"
                          ,uVar5,
                          "int (anonymous namespace)::startChild(Context &, Elf::Object::sptr, const std::string &)"
                         );
          }
          statusBuf[8] = '\0';
          statusBuf[9] = '\0';
          statusBuf[10] = '\0';
          statusBuf[0xb] = '\0';
          statusBuf[0xc] = '\0';
          statusBuf[0xd] = '\0';
          statusBuf[0xe] = '\0';
          statusBuf[0xf] = '\0';
          line[0xff8] = '\0';
          line[0xff9] = '\0';
          line[0xffa] = '\0';
          line[0xffb] = '\0';
          line[0xffc] = '\0';
          line[0xffd] = '\0';
          line[0xffe] = '\0';
          line[0xfff] = '\0';
          statusBuf[0] = '\0';
          statusBuf[1] = '\0';
          statusBuf[2] = '\0';
          statusBuf[3] = '\0';
          statusBuf[4] = '\0';
          statusBuf[5] = '\0';
          statusBuf[6] = '\0';
          statusBuf[7] = '\0';
          for (auVar18 = auStack_88; auVar18 != (undefined1  [8])pbVar2;
              auVar18 = (undefined1  [8])((long)auVar18 + 0x20)) {
            local_26f8 = (undefined1  [8])(((pointer)auVar18)->_M_dataplus)._M_p;
            std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                      ((vector<char_const*,std::allocator<char_const*>> *)(line + 0xff8),
                       (char **)local_26f8);
          }
          local_26f8 = (undefined1  [8])0x0;
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)(line + 0xff8),
                     (char **)local_26f8);
          execvp(*(char **)line._4088_8_,(char **)line._4088_8_);
          if (2 < local_228) {
            _Var7 = getpid();
            poVar13 = (ostream *)std::ostream::operator<<(local_250,_Var7);
            poVar13 = std::operator<<(poVar13," execvp failed: ");
            piVar14 = __errno_location();
            pcVar15 = strerror(*piVar14);
            poVar13 = std::operator<<(poVar13,pcVar15);
            std::operator<<(poVar13,"\n");
          }
          std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                    ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)(line + 0xff8));
        }
        else {
          sleepTime = 0.0;
          p.super___shared_ptr<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          snprintf(line + 0xff8,0x1000,"/proc/%d/status",(ulong)uVar5);
          __stream = fopen64(line + 0xff8,"r");
          if (__stream == (FILE *)0x0) {
            pcVar15 = "statusFile.get()";
            uVar5 = 0x5f;
            execName.field_2._8_8_ = 0;
            goto LAB_0010a64e;
          }
          execName.field_2._8_8_ = __stream;
          while( true ) {
            if (2 < local_228) {
              _Var7 = getpid();
              poVar13 = (ostream *)std::ostream::operator<<(local_250,_Var7);
              std::operator<<(poVar13," waiting...\n");
            }
            _Var7 = wait(local_148);
            if (_Var7 != local_108._0_4_) break;
            if (2 < local_228) {
              _Var6 = getpid();
              poVar13 = (ostream *)std::ostream::operator<<(local_250,_Var6);
              poVar13 = std::operator<<(poVar13,"... done - rc=");
              poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,_Var7);
              poVar13 = std::operator<<(poVar13,", status=");
              poVar13 = (ostream *)pstack::Procman::operator<<(poVar13,(WaitStatus)local_148._0_4_);
              std::operator<<(poVar13,"\n");
            }
            if (local_148[0] != '\x7f') goto LAB_0010a505;
            fflush(__stream);
            fseek(__stream,0,0);
            uVar10 = 0xffffffffffffffff;
            uVar11 = uVar10;
            uVar12 = uVar10;
            while (pcVar15 = fgets(local_26f8,0x1000,__stream), pcVar15 != (char *)0x0) {
              if (local_26f8 == (undefined1  [8])0x93a746743676953) {
                uVar12 = strtoull(line,(char **)0x0,0x10);
              }
              else if (local_26f8 == (undefined1  [8])0x93a6e6749676953) {
                uVar11 = strtoull(line,(char **)0x0,0x10);
              }
              else if (local_26f8 == (undefined1  [8])0x93a6b6c42676953) {
                uVar10 = strtoull(line,(char **)0x0,0x10);
              }
            }
            uVar16 = (uint)local_148._0_4_ >> 8 & 0xff;
            uVar5 = uVar16;
            if (uVar16 == 5) {
              uVar5 = 0;
            }
            uVar19 = (ulong)uVar5;
            if (uVar16 == 0x13) {
              uVar19 = 0;
            }
            if (((uVar10 | uVar11 | uVar12 | 0x10) & (long)(1 << (local_148[1] - 1U & 0x1f))) == 0)
            {
              local_208._M_pod_data[0] = 1;
              __r_00 = (__shared_ptr<pstack::Procman::LiveProcess,_(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&subprocessCmd.field_2 + 8);
              std::
              make_shared<pstack::Procman::LiveProcess,pstack::Context&,std::shared_ptr<pstack::Elf::Object>&,int&,bool>
                        ((Context *)__r_00,(shared_ptr<pstack::Elf::Object> *)local_2c8,
                         (int *)local_128,(bool *)local_108);
              std::__shared_ptr<pstack::Procman::Process,(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<pstack::Procman::Process,(__gnu_cxx::_Lock_policy)2> *)
                         &sleepTime,__r_00);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160);
              pstack::Procman::Process::load();
              anon_unknown.dwarf_15934::pstack((Process *)sleepTime);
              __request = PTRACE_KILL;
            }
            else {
              __request = PTRACE_CONT;
            }
            lVar17 = ptrace(__request,(ulong)(uint)local_108._0_4_,0,uVar19);
            if ((int)lVar17 != 0) {
              if ((int)lVar17 == -1) {
                _Var7 = getpid();
                poVar13 = (ostream *)std::ostream::operator<<(local_250,_Var7);
                poVar13 = std::operator<<(poVar13," ptrace failed to kill/continue - ");
                piVar14 = __errno_location();
                pcVar15 = strerror(*piVar14);
                poVar13 = std::operator<<(poVar13,pcVar15);
                std::operator<<(poVar13,"\n");
              }
              __assert_fail("rc == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc"
                            ,0x8a,
                            "int (anonymous namespace)::startChild(Context &, Elf::Object::sptr, const std::string &)"
                           );
            }
            if (2 < local_228) {
              _Var7 = getpid();
              poVar13 = (ostream *)std::ostream::operator<<(local_250,_Var7);
              std::operator<<(poVar13,"..done\n");
            }
          }
          if (2 < local_228) {
            _Var7 = getpid();
            poVar13 = (ostream *)std::ostream::operator<<(local_250,_Var7);
            poVar13 = std::operator<<(poVar13,"... wait failed: ");
            piVar14 = __errno_location();
            pcVar15 = strerror(*piVar14);
            poVar13 = std::operator<<(poVar13,pcVar15);
            std::operator<<(poVar13,"\n");
          }
LAB_0010a505:
          std::unique_ptr<_IO_FILE,_closer>::~unique_ptr
                    ((unique_ptr<_IO_FILE,_closer> *)((long)&execName.field_2 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
      iVar4 = 0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&exec);
  }
  pstack::Flags::~Flags((Flags *)auStack_458);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_1e8);
  std::ofstream::~ofstream(local_6f0);
  if ((anonymous_namespace)::freeres == '\0') {
    exit(iVar4);
  }
  pstack::Context::~Context((Context *)local_2c8);
  return iVar4;
}

Assistant:

int
main(int argc, char **argv)
{
    try {
        Context context;
        struct sigaction sa;
        memset(&sa, 0, sizeof sa);
        sa.sa_handler = [](int) { interrupted = true; };
        // Only interrupt cleanly once. Then just terminate, in case we're stuck in a loop
        sa.sa_flags = SA_RESETHAND;
        sigaction(SIGINT, &sa, nullptr);
        int rc = emain(argc, argv, context);

        // Normally, exit without free'ing imagecache - don't waste effort
        // moving pointers around in a terminating process
        if (!freeres)
           exit(rc);
        return rc;
    }
    catch (std::exception &ex) {
        std::clog << "error: " << ex.what() << std::endl;
        return EX_SOFTWARE;
    }
}